

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O3

int __thiscall Cleaner::CleanDead(Cleaner *this,Entries *entries)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Node *pNVar2;
  _Hash_node_base *p_Var3;
  string local_40;
  
  this->status_ = 0;
  this->cleaned_files_count_ = 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->removed_)._M_t);
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::clear(&(this->cleaned_)._M_t);
  PrintHeader(this);
  p_Var3 = (entries->_M_h)._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    paVar1 = &local_40.field_2;
    do {
      pNVar2 = State::LookupNode(this->state_,*(StringPiece *)(p_Var3 + 1));
      if ((pNVar2 == (Node *)0x0) || (pNVar2->in_edge_ == (Edge *)0x0)) {
        local_40._M_dataplus._M_p = (pointer)paVar1;
        if (p_Var3[2]._M_nxt == (_Hash_node_base *)0x0) {
          local_40._M_string_length = 0;
          local_40.field_2._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,p_Var3[1]._M_nxt,
                     (long)&(p_Var3[1]._M_nxt)->_M_nxt + (long)&(p_Var3[2]._M_nxt)->_M_nxt);
        }
        Remove(this,&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != paVar1) {
          operator_delete(local_40._M_dataplus._M_p,
                          CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                                   local_40.field_2._M_local_buf[0]) + 1);
        }
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  if (*(int *)this->config_ != 1) {
    printf("%d files.\n",(ulong)(uint)this->cleaned_files_count_);
  }
  return this->status_;
}

Assistant:

int Cleaner::CleanDead(const BuildLog::Entries& entries) {
  Reset();
  PrintHeader();
  for (BuildLog::Entries::const_iterator i = entries.begin(); i != entries.end(); ++i) {
    Node* n = state_->LookupNode(i->first);
    if (!n || !n->in_edge()) {
      Remove(i->first.AsString());
    }
  }
  PrintFooter();
  return status_;
}